

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.c
# Opt level: O2

int32 mmi_viterbi_update(vector_t **feature,uint32 n_obs,state_t *state_seq,uint32 n_state,
                        model_inventory_t *inv,float64 a_beam,int32 mean_reest,int32 var_reest,
                        float64 arc_gamma,feat_t *fcb)

{
  uint n_feat;
  uint uVar1;
  uint n_top;
  uint n_lcl;
  uint uVar2;
  gauden_t *g;
  float32 ***pppfVar3;
  uint32 *lcl2gbl;
  float64 op;
  int iVar4;
  float64 *scale;
  float64 **dscale;
  uint32 *n_active_astate;
  float64 **active_alpha;
  uint32 **active_astate;
  uint32 *cb;
  uint32 **bp;
  cmd_ln_t *cmdln;
  char *pcVar5;
  state_t *psVar6;
  uint32 n_cb;
  size_t __n;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong n_elem;
  ulong uVar11;
  uint32 ***local_110;
  float64 ***local_108;
  float32 ***local_d8;
  
  if (n_obs == 0) {
    __assert_fail("n_obs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x349,
                  "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                 );
  }
  if (n_state == 0) {
    __assert_fail("n_state > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x34a,
                  "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                 );
  }
  n_elem = (ulong)n_obs;
  g = inv->gauden;
  n_feat = g->n_feat;
  uVar9 = (ulong)n_feat;
  uVar1 = g->n_density;
  n_top = g->n_top;
  uVar10 = (ulong)n_top;
  if (mmi_viterbi_update::p_op == (float64 *)0x0) {
    mmi_viterbi_update::p_op =
         (float64 *)
         __ckd_calloc__(uVar9,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x353);
    mmi_viterbi_update::p_ci_op =
         (float64 *)
         __ckd_calloc__(uVar9,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x354);
  }
  if (mmi_viterbi_update::d_term == (float64 **)0x0) {
    mmi_viterbi_update::d_term =
         (float64 **)
         __ckd_calloc_2d__(uVar9,uVar10,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                           ,0x358);
    mmi_viterbi_update::d_term_ci =
         (float64 **)
         __ckd_calloc_2d__(uVar9,uVar10,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                           ,0x359);
  }
  scale = (float64 *)
          __ckd_calloc__(n_elem,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                         ,0x35c);
  dscale = (float64 **)
           __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                          ,0x35d);
  n_active_astate =
       (uint32 *)
       __ckd_calloc__(n_elem,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x35e);
  active_alpha = (float64 **)
                 __ckd_calloc__(n_elem,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                ,0x35f);
  active_astate =
       (uint32 **)
       __ckd_calloc__(n_elem,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x360);
  cb = (uint32 *)
       __ckd_calloc__((ulong)(n_state * 2),4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x361);
  bp = (uint32 **)
       __ckd_calloc__(n_elem,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x362);
  iVar4 = forward(active_alpha,active_astate,n_active_astate,bp,scale,dscale,feature,n_obs,state_seq
                  ,n_state,inv,a_beam,(s3phseg_t *)0x0,(bw_timers_t *)0x0,1);
  cmdln = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(cmdln,"-outphsegdir");
  if (pcVar5 != (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x36b,"current MMI implementation don\'t support -outphsegdir\n");
    exit(1);
  }
  if (iVar4 == 0) {
    pppfVar3 = inv->mixw;
    lcl2gbl = inv->cb_inverse;
    n_lcl = inv->n_cb_inverse;
    uVar8 = (ulong)n_lcl;
    gauden_alloc_l_acc(g,n_lcl,mean_reest,var_reest,0);
    local_108 = (float64 ***)
                __ckd_calloc_3d__(uVar8,uVar9,uVar10,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                  ,0x386);
    local_110 = (uint32 ***)
                __ckd_calloc_3d__(uVar8,uVar9,uVar10,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                  ,0x38a);
    if (var_reest == 0 && mean_reest == 0) {
      local_d8 = (float32 ***)0x0;
      __n = 0;
    }
    else {
      local_d8 = (float32 ***)
                 __ckd_calloc_3d__(uVar8,uVar9,(ulong)uVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                   ,0x391);
      __n = (ulong)(n_feat * uVar1 * n_lcl) << 2;
    }
    uVar10 = (ulong)(n_obs - 1);
    for (uVar9 = 0; n_active_astate[uVar10] != uVar9; uVar9 = uVar9 + 1) {
      if (active_astate[uVar10][uVar9] == n_state - 1) {
        if (n_active_astate[uVar10] != (uint)uVar9) goto LAB_0010dd48;
        break;
      }
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x3a2,"Failed to align audio to trancript: final state of the search is not reached\n")
    ;
    iVar4 = -1;
  }
  else {
    local_d8 = (float32 ***)0x0;
    local_110 = (uint32 ***)0x0;
    local_108 = (float64 ***)0x0;
  }
  goto LAB_0010dc1d;
LAB_0010dd48:
  uVar8 = uVar10;
  iVar7 = (int)uVar8;
  if (-1 < iVar7) {
    while( true ) {
      uVar11 = uVar9 & 0xffffffff;
      if (state_seq[active_astate[uVar8][uVar11]].mixw != 0xffffffff) break;
      uVar9 = (ulong)bp[uVar8][uVar11];
    }
    psVar6 = state_seq + active_astate[uVar8][uVar11];
    uVar1 = psVar6->l_cb;
    uVar2 = psVar6->l_ci_cb;
    gauden_compute_log(local_108[uVar1],local_110[uVar1],feature[uVar8],g,psVar6->cb,(uint32 **)0x0)
    ;
    *cb = uVar1;
    n_cb = 1;
    if (uVar1 != uVar2) {
      gauden_compute_log(local_108[uVar2],local_110[uVar2],feature[uVar8],g,psVar6->ci_cb,
                         (uint32 **)0x0);
      cb[1] = uVar2;
      n_cb = 2;
    }
    iVar4 = gauden_scale_densities_bwd(local_108,local_110,dscale + uVar8,cb,n_cb,g);
    if (iVar4 != 0) goto LAB_0010dc1d;
    if ((ulong)psVar6->mixw == 0xffffffff) {
      __assert_fail("state_seq[j].mixw != TYING_NON_EMITTING",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                    ,0x3d2,
                    "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                   );
    }
    op = gauden_mixture(local_108[uVar1],local_110[uVar1],pppfVar3[psVar6->mixw],g);
    partial_op(mmi_viterbi_update::p_op,op,local_108[uVar1],local_110[uVar1],pppfVar3[psVar6->mixw],
               n_feat,n_top);
    den_terms(mmi_viterbi_update::d_term,(float64)(1.0 / (double)op),mmi_viterbi_update::p_op,
              local_108[uVar1],local_110[uVar1],pppfVar3[psVar6->mixw],n_feat,n_top);
    if (uVar1 != uVar2) {
      partial_ci_op(mmi_viterbi_update::p_ci_op,local_108[uVar2],local_110[uVar2],
                    pppfVar3[psVar6->ci_mixw],n_feat,n_top);
      den_terms_ci(mmi_viterbi_update::d_term_ci,1.0,mmi_viterbi_update::p_ci_op,local_108[uVar2],
                   local_110[uVar2],pppfVar3[psVar6->ci_mixw],n_feat,n_top);
    }
    if (var_reest != 0 || mean_reest != 0) {
      accum_den_terms(local_d8[uVar1],mmi_viterbi_update::d_term,local_110[uVar1],n_feat,n_top);
      if (uVar1 != uVar2) {
        accum_den_terms(local_d8[uVar2],mmi_viterbi_update::d_term_ci,local_110[uVar2],n_feat,n_top)
        ;
      }
      mmi_accum_gauden(local_d8,lcl2gbl,n_lcl,feature[uVar8],local_110,g,mean_reest,var_reest,
                       arc_gamma,fcb);
      memset(**local_d8,0,__n);
    }
    uVar10 = (ulong)(iVar7 - 1);
    if (iVar7 != 0) {
      uVar9 = (ulong)bp[uVar8][uVar11];
    }
    goto LAB_0010dd48;
  }
  iVar4 = 0;
  accum_global(inv,state_seq,n_state,0,0,mean_reest,var_reest,0);
LAB_0010dc1d:
  ckd_free(scale);
  for (uVar10 = 0; n_elem != uVar10; uVar10 = uVar10 + 1) {
    if (dscale[uVar10] != (float64 *)0x0) {
      ckd_free(dscale[uVar10]);
    }
  }
  ckd_free(dscale);
  ckd_free(n_active_astate);
  for (uVar10 = 0; n_elem != uVar10; uVar10 = uVar10 + 1) {
    ckd_free(active_alpha[uVar10]);
    ckd_free(active_astate[uVar10]);
    ckd_free(bp[uVar10]);
  }
  ckd_free(active_alpha);
  ckd_free(active_astate);
  ckd_free(cb);
  ckd_free(bp);
  if (local_d8 != (float32 ***)0x0) {
    ckd_free_3d(local_d8);
  }
  if (local_108 != (float64 ***)0x0) {
    ckd_free_3d(local_108);
  }
  if (local_110 != (uint32 ***)0x0) {
    ckd_free_3d(local_110);
  }
  if (iVar4 != 0) {
    pcVar5 = corpus_utt_brief_name();
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x44d,"viterbi update error in sentence %s\n",pcVar5);
  }
  return iVar4;
}

Assistant:

int32
mmi_viterbi_update(vector_t **feature,
		   uint32 n_obs,
		   state_t *state_seq,
		   uint32 n_state,
		   model_inventory_t *inv,
		   float64 a_beam,
		   int32 mean_reest,
		   int32 var_reest,
		   float64 arc_gamma,
		   feat_t *fcb)
{
    float64 *scale = NULL;
    float64 **dscale = NULL;
    float64 **active_alpha;
    uint32 **active_astate;
    uint32 **bp;
    uint32 *n_active_astate;
    gauden_t *g;/* Gaussian density parameters and reestimation sums */
    float32 ***mixw;/* all mixing weights */
    float64 ***now_den = NULL;/* Short for den[t] */
    uint32 ***now_den_idx = NULL;/* Short for den_idx[t] */
    uint32 *active_cb;
    uint32 n_active_cb;
    float32 ***denacc = NULL;/* mean/var reestimation accumulators for time t */
    size_t denacc_size;/* Total size of data references in denacc.  Allows
			  for quick clears between time frames */
    uint32 n_lcl_cb;
    uint32 *cb_inv;
    uint32 i, j, q;
    int32 t;
    uint32 n_feat;
    uint32 n_density;
    uint32 n_top;
    int ret;
    uint32 n_cb;

    static float64 *p_op = NULL;
    static float64 *p_ci_op = NULL;
    static float64 **d_term = NULL;
    static float64 **d_term_ci = NULL;

    /* caller must ensure that there is some non-zero amount
       of work to be done here */
    assert(n_obs > 0);
    assert(n_state > 0);

    g = inv->gauden;
    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);
    n_top = gauden_n_top(g);
    n_cb = gauden_n_mgau(g);

    if (p_op == NULL) {
	p_op    = ckd_calloc(n_feat, sizeof(float64));
	p_ci_op = ckd_calloc(n_feat, sizeof(float64));
    }

    if (d_term == NULL) {
	d_term    = (float64 **)ckd_calloc_2d(n_feat, n_top, sizeof(float64));
	d_term_ci = (float64 **)ckd_calloc_2d(n_feat, n_top, sizeof(float64));
    }

    scale = (float64 *)ckd_calloc(n_obs, sizeof(float64));
    dscale = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    n_active_astate = (uint32 *)ckd_calloc(n_obs, sizeof(uint32));
    active_alpha  = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    active_astate = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));
    active_cb = ckd_calloc(2*n_state, sizeof(uint32));
    bp = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));

    /* Run forward algorithm, which has embedded Viterbi. */
    ret = forward(active_alpha, active_astate, n_active_astate, bp,
		  scale, dscale,
		  feature, n_obs, state_seq, n_state,
		  inv, a_beam, NULL, NULL, 1);
    
    if (cmd_ln_str("-outphsegdir")) {
	E_FATAL("current MMI implementation don't support -outphsegdir\n");
    }


    if (ret != S3_SUCCESS) {

	/* Some problem with the utterance, release per utterance storage and
	 * forget about adding the utterance accumulators to the global accumulators */

	goto all_done;
    }

    mixw = inv->mixw;

    n_lcl_cb = inv->n_cb_inverse;
    cb_inv = inv->cb_inverse;

    /* Allocate local accumulators for mean, variance reestimation
       sums if necessary */
    gauden_alloc_l_acc(g, n_lcl_cb,
		       mean_reest, var_reest,
		       FALSE);

    n_active_cb = 0;
    now_den = (float64 ***)ckd_calloc_3d(n_lcl_cb,
					 n_feat,
					 n_top,
					 sizeof(float64));
    now_den_idx =  (uint32 ***)ckd_calloc_3d(n_lcl_cb,
					     n_feat,
					     n_top,
					     sizeof(uint32));

    if (mean_reest || var_reest) {
	/* allocate space for the per frame density counts */
	denacc = (float32 ***)ckd_calloc_3d(n_lcl_cb,
					    n_feat,
					    n_density,
					    sizeof(float32));

	/* # of bytes required to store all weighted vectors */
	denacc_size = n_lcl_cb * n_feat * n_density * sizeof(float32);
    }
    else {
	denacc = NULL;
	denacc_size = 0;
    }

    /* Okay now run through the backtrace and accumulate counts. */
    /* Find the non-emitting ending state */
    for (q = 0; q < n_active_astate[n_obs-1]; ++q) {
	if (active_astate[n_obs-1][q] == n_state-1)
	    break;
    }
    if (q == n_active_astate[n_obs-1]) {
	E_ERROR("Failed to align audio to trancript: final state of the search is not reached\n");
	ret = S3_ERROR;
	goto all_done;
    }

    for (t = n_obs-1; t >= 0; --t) {
	uint32 l_cb;
	uint32 l_ci_cb;
	float64 op, p_reest_term;
	uint32 prev;

	j = active_astate[t][q];

	/* Follow any non-emitting states at time t first. */
	while (state_seq[j].mixw == TYING_NON_EMITTING) {
	    prev = active_astate[t][bp[t][q]];
	    q = bp[t][q];
	    j = prev;
	}

	/* Now accumulate statistics for the real state. */
	l_cb = state_seq[j].l_cb;
	l_ci_cb = state_seq[j].l_ci_cb;
	n_active_cb = 0;

	gauden_compute_log(now_den[l_cb],
			   now_den_idx[l_cb],
			   feature[t],
			   g,
			   state_seq[j].cb,
			   NULL);
	active_cb[n_active_cb++] = l_cb;

	if (l_cb != l_ci_cb) {
	    gauden_compute_log(now_den[l_ci_cb],
			       now_den_idx[l_ci_cb],
			       feature[t],
			       g,
			       state_seq[j].ci_cb,
			       NULL);
	    active_cb[n_active_cb++] = l_ci_cb;
	}
	ret = gauden_scale_densities_bwd(now_den, now_den_idx,
					 &dscale[t],
					 active_cb, n_active_cb, g);
	if (ret != S3_SUCCESS)
	    goto all_done;
	
	assert(state_seq[j].mixw != TYING_NON_EMITTING);
	/* Now calculate mixture densities. */
	/* This is the normalizer sum_m c_{jm} p(o_t|\lambda_{jm}) */
	op = gauden_mixture(now_den[l_cb], now_den_idx[l_cb],
			    mixw[state_seq[j].mixw], g);

	/* Make up this bogus value to be consistent with backward.c */
	p_reest_term = 1.0 / op;

	/* Compute the output probability excluding the contribution
	 * of each feature stream.  i.e. p_op[0] is the output
	 * probability excluding feature stream 0 */
	partial_op(p_op,
		   op,
		   now_den[l_cb],
		   now_den_idx[l_cb],
		   mixw[state_seq[j].mixw],
		   n_feat,
		   n_top);

	/* compute the probability of each (of possibly topn) density */
	den_terms(d_term,
		  p_reest_term,
		  p_op,
		  now_den[l_cb],
		  now_den_idx[l_cb],
		  mixw[state_seq[j].mixw],
		  n_feat,
		  n_top);

	if (l_cb != l_ci_cb) {
	    /* For each feature stream f, compute:
	     *     sum_k(mixw[f][k] den[f][k])
	     * and store the results in p_ci_op */
	    partial_ci_op(p_ci_op,
			  now_den[l_ci_cb],
			  now_den_idx[l_ci_cb],
			  mixw[state_seq[j].ci_mixw],
			  n_feat,
			  n_top);

	    /* For each feature stream and density compute the terms:
	     *   w[f][k] den[f][k] / sum_k(w[f][k] den[f][k]) * post_j
	     * and store results in d_term_ci */
	    den_terms_ci(d_term_ci,
			 1.0, /* post_j = 1.0 */
			 p_ci_op,
			 now_den[l_ci_cb],
			 now_den_idx[l_ci_cb],
			 mixw[state_seq[j].ci_mixw],
			 n_feat,
			 n_top);
	}
	    
	/* accumulate the probability for each density in the 
	 * density reestimation accumulators */
	if (mean_reest || var_reest) {
	    accum_den_terms(denacc[l_cb], d_term,
			    now_den_idx[l_cb], n_feat, n_top);
	    if (l_cb != l_ci_cb) {
		accum_den_terms(denacc[l_ci_cb], d_term_ci,
				now_den_idx[l_ci_cb], n_feat, n_top);
	    }
	}
	
	/* Note that there is only one state/frame so this is kind of
	   redundant */
	if (mean_reest || var_reest) {
	    /* Update the mean and variance reestimation accumulators */
	    mmi_accum_gauden(denacc,
			     cb_inv,
			     n_lcl_cb,
			     feature[t],
			     now_den_idx,
			     g,
			     mean_reest,
			     var_reest,
			     arc_gamma,
			     fcb);
	    memset(&denacc[0][0][0], 0, denacc_size);
	}
	
	if (t > 0) { 
	    prev = active_astate[t-1][bp[t][q]];
	    q = bp[t][q];
	    j = prev;
	}
    }

    /* If no error was found, add the resulting utterance reestimation
     * accumulators to the global reestimation accumulators */
    accum_global(inv, state_seq, n_state,
		 FALSE, FALSE, mean_reest, var_reest,
		 FALSE);

 all_done:
    ckd_free((void *)scale);
    for (i = 0; i < n_obs; i++) {
	if (dscale[i])
	    ckd_free((void *)dscale[i]);
    }
    ckd_free((void **)dscale);
    
    ckd_free(n_active_astate);
    for (i = 0; i < n_obs; i++) {
	ckd_free((void *)active_alpha[i]);
	ckd_free((void *)active_astate[i]);
	ckd_free((void *)bp[i]);
    }
    ckd_free((void *)active_alpha);
    ckd_free((void *)active_astate);
    ckd_free((void *)active_cb);
    ckd_free((void **)bp);

    if (denacc)
	ckd_free_3d((void ***)denacc);

    if (now_den)
	ckd_free_3d((void ***)now_den);
    if (now_den_idx)
	ckd_free_3d((void ***)now_den_idx);

    if (ret != S3_SUCCESS)
	E_ERROR("viterbi update error in sentence %s\n", corpus_utt_brief_name());

    return ret;
}